

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.cc
# Opt level: O2

void __thiscall
testing::internal::ExpectationBase::FindUnsatisfiedPrerequisites
          (ExpectationBase *this,ExpectationSet *result)

{
  ExpectationBase *pEVar1;
  element_type *peVar2;
  int iVar3;
  _Rb_tree_node_base *p_Var4;
  allocator_type local_49;
  ExpectationBase *next;
  vector<const_testing::internal::ExpectationBase_*,_std::allocator<const_testing::internal::ExpectationBase_*>_>
  expectations;
  
  next = this;
  std::
  vector<const_testing::internal::ExpectationBase_*,_std::allocator<const_testing::internal::ExpectationBase_*>_>
  ::vector(&expectations,1,&next,&local_49);
  while (expectations.
         super__Vector_base<const_testing::internal::ExpectationBase_*,_std::allocator<const_testing::internal::ExpectationBase_*>_>
         ._M_impl.super__Vector_impl_data._M_start !=
         expectations.
         super__Vector_base<const_testing::internal::ExpectationBase_*,_std::allocator<const_testing::internal::ExpectationBase_*>_>
         ._M_impl.super__Vector_impl_data._M_finish) {
    pEVar1 = expectations.
             super__Vector_base<const_testing::internal::ExpectationBase_*,_std::allocator<const_testing::internal::ExpectationBase_*>_>
             ._M_impl.super__Vector_impl_data._M_finish[-1];
    expectations.
    super__Vector_base<const_testing::internal::ExpectationBase_*,_std::allocator<const_testing::internal::ExpectationBase_*>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         expectations.
         super__Vector_base<const_testing::internal::ExpectationBase_*,_std::allocator<const_testing::internal::ExpectationBase_*>_>
         ._M_impl.super__Vector_impl_data._M_finish + -1;
    for (p_Var4 = (pEVar1->immediate_prerequisites_).expectations_._M_t._M_impl.
                  super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var4 !=
        &(pEVar1->immediate_prerequisites_).expectations_._M_t._M_impl.super__Rb_tree_header;
        p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4)) {
      next = *(ExpectationBase **)(p_Var4 + 1);
      peVar2 = (next->cardinality_).impl_.
               super___shared_ptr<const_testing::CardinalityInterface,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      iVar3 = (*peVar2->_vptr_CardinalityInterface[4])(peVar2,(ulong)(uint)next->call_count_);
      if ((char)iVar3 == '\0') {
        std::
        _Rb_tree<testing::Expectation,testing::Expectation,std::_Identity<testing::Expectation>,testing::Expectation::Less,std::allocator<testing::Expectation>>
        ::_M_insert_unique<testing::Expectation_const&>
                  ((_Rb_tree<testing::Expectation,testing::Expectation,std::_Identity<testing::Expectation>,testing::Expectation::Less,std::allocator<testing::Expectation>>
                    *)result,(Expectation *)(p_Var4 + 1));
      }
      else if (next->call_count_ == 0) {
        std::
        vector<const_testing::internal::ExpectationBase_*,_std::allocator<const_testing::internal::ExpectationBase_*>_>
        ::push_back(&expectations,&next);
      }
    }
  }
  std::
  _Vector_base<const_testing::internal::ExpectationBase_*,_std::allocator<const_testing::internal::ExpectationBase_*>_>
  ::~_Vector_base(&expectations.
                   super__Vector_base<const_testing::internal::ExpectationBase_*,_std::allocator<const_testing::internal::ExpectationBase_*>_>
                 );
  return;
}

Assistant:

GTEST_EXCLUSIVE_LOCK_REQUIRED_(g_gmock_mutex) {
  g_gmock_mutex.AssertHeld();
  ::std::vector<const ExpectationBase*> expectations(1, this);
  while (!expectations.empty()) {
    const ExpectationBase* exp = expectations.back();
    expectations.pop_back();

    for (ExpectationSet::const_iterator it =
             exp->immediate_prerequisites_.begin();
         it != exp->immediate_prerequisites_.end(); ++it) {
      const ExpectationBase* next = it->expectation_base().get();

      if (next->IsSatisfied()) {
        // If *it is satisfied and has a call count of 0, some of its
        // pre-requisites may not be satisfied yet.
        if (next->call_count_ == 0) {
          expectations.push_back(next);
        }
      } else {
        // Now that we know next is unsatisfied, we are not so interested
        // in whether its pre-requisites are satisfied.  Therefore we
        // don't iterate into it here.
        *result += *it;
      }
    }
  }
}